

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polyline.cc
# Opt level: O0

bool __thiscall S2Polyline::MayIntersect(S2Polyline *this,S2Cell *cell)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  S2Point *pSVar5;
  long lVar6;
  Vector3<double> *local_148;
  int local_124;
  undefined1 local_120 [4];
  int i_2;
  S2EdgeCrosser crosser;
  undefined1 auStack_a8 [4];
  int j;
  VType local_a0;
  VType local_98;
  int local_8c;
  undefined1 local_88 [4];
  int i_1;
  S2Point cell_vertices [4];
  int i;
  S2Cell *cell_local;
  S2Polyline *this_local;
  
  iVar2 = num_vertices(this);
  if (iVar2 != 0) {
    for (cell_vertices[3].c_[2]._4_4_ = 0; iVar2 = cell_vertices[3].c_[2]._4_4_,
        iVar3 = num_vertices(this), iVar2 < iVar3;
        cell_vertices[3].c_[2]._4_4_ = cell_vertices[3].c_[2]._4_4_ + 1) {
      pSVar5 = vertex(this,cell_vertices[3].c_[2]._4_4_);
      bVar1 = S2Cell::Contains(cell,pSVar5);
      if (bVar1) {
        return true;
      }
    }
    local_148 = (Vector3<double> *)local_88;
    do {
      Vector3<double>::Vector3(local_148);
      local_148 = local_148 + 1;
    } while (local_148 != (Vector3<double> *)(cell_vertices[3].c_ + 2));
    for (local_8c = 0; local_8c < 4; local_8c = local_8c + 1) {
      S2Cell::GetVertex((S2Point *)auStack_a8,cell,local_8c);
      lVar6 = (long)local_8c;
      *(VType *)(local_88 + lVar6 * 0x18) = _auStack_a8;
      cell_vertices[lVar6].c_[0] = local_a0;
      cell_vertices[lVar6].c_[1] = local_98;
    }
    for (crosser.bda_ = 0; crosser.bda_ < 4; crosser.bda_ = crosser.bda_ + 1) {
      lVar6 = (long)crosser.bda_;
      uVar4 = crosser.bda_ + 1;
      pSVar5 = vertex(this,0);
      S2EdgeCrosser::S2EdgeCrosser
                ((S2EdgeCrosser *)local_120,(S2Point *)(local_88 + lVar6 * 0x18),
                 (S2Point *)(local_88 + (long)(int)(uVar4 & 3) * 0x18),pSVar5);
      for (local_124 = 1; iVar2 = num_vertices(this), local_124 < iVar2; local_124 = local_124 + 1)
      {
        pSVar5 = vertex(this,local_124);
        iVar2 = S2EdgeCrosser::CrossingSign((S2EdgeCrosser *)local_120,pSVar5);
        if (-1 < iVar2) {
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

bool S2Polyline::MayIntersect(const S2Cell& cell) const {
  if (num_vertices() == 0) return false;

  // We only need to check whether the cell contains vertex 0 for correctness,
  // but these tests are cheap compared to edge crossings so we might as well
  // check all the vertices.
  for (int i = 0; i < num_vertices(); ++i) {
    if (cell.Contains(vertex(i))) return true;
  }
  S2Point cell_vertices[4];
  for (int i = 0; i < 4; ++i) {
    cell_vertices[i] = cell.GetVertex(i);
  }
  for (int j = 0; j < 4; ++j) {
    S2EdgeCrosser crosser(&cell_vertices[j], &cell_vertices[(j+1)&3],
                                    &vertex(0));
    for (int i = 1; i < num_vertices(); ++i) {
      if (crosser.CrossingSign(&vertex(i)) >= 0) {
        // There is a proper crossing, or two vertices were the same.
        return true;
      }
    }
  }
  return false;
}